

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

void wallet::DiscourageFeeSniping
               (CMutableTransaction *tx,FastRandomContext *rng_fast,Chain *chain,uint256 *block_hash
               ,int block_height)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  RandomMixin<FastRandomContext> *in_RCX;
  Chain *in_RDX;
  long in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  CTxIn *in;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  iterator __end1;
  iterator __begin1;
  __normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *in_stack_ffffffffffffff98
  ;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  reference in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::vector<CTxIn,_std::allocator<CTxIn>_>::empty
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffffa8);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!tx.vin.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/spend.cpp"
                  ,0x3af,
                  "void wallet::DiscourageFeeSniping(CMutableTransaction &, FastRandomContext &, interfaces::Chain &, const uint256 &, int)"
                 );
  }
  bVar2 = IsCurrentForAntiFeeSniping(in_RDX,(uint256 *)in_RCX);
  if (bVar2) {
    *(int *)(in_RDI + 0x34) = in_R8D;
    iVar3 = RandomMixin<FastRandomContext>::randrange<int>(in_RCX,in_R8D);
    if (iVar3 == 0) {
      in_stack_ffffffffffffffa4 = *(undefined4 *)(in_RDI + 0x34);
      RandomMixin<FastRandomContext>::randrange<int>(in_RCX,in_R8D);
      piVar4 = std::max<int>((int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             (int *)in_stack_ffffffffffffff98);
      *(int *)(in_RDI + 0x34) = *piVar4;
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0x34) = 0;
  }
  if (*(uint *)(in_RDI + 0x34) < 500000000) {
    if ((ulong)(long)in_R8D < (ulong)*(uint *)(in_RDI + 0x34)) {
      __assert_fail("tx.nLockTime <= uint64_t(block_height)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/spend.cpp"
                    ,0x3d6,
                    "void wallet::DiscourageFeeSniping(CMutableTransaction &, FastRandomContext &, interfaces::Chain &, const uint256 &, int)"
                   );
    }
    std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::end
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    while( true ) {
      bVar2 = __gnu_cxx::operator==<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        ((__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                         in_stack_ffffffffffffffa8,
                         (__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
          __stack_chk_fail();
        }
        return;
      }
      in_stack_ffffffffffffffa8 =
           __gnu_cxx::__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
           operator*(in_stack_ffffffffffffff98);
      if (in_stack_ffffffffffffffa8->nSequence == 0xffffffff) break;
      if ((in_stack_ffffffffffffffa8->nSequence != 0xfffffffe) &&
         (in_stack_ffffffffffffffa8->nSequence != 0xfffffffd)) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/spend.cpp"
                      ,0x3df,
                      "void wallet::DiscourageFeeSniping(CMutableTransaction &, FastRandomContext &, interfaces::Chain &, const uint256 &, int)"
                     );
      }
      __gnu_cxx::__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::operator++
                (in_stack_ffffffffffffff98);
    }
    __assert_fail("in.nSequence != CTxIn::SEQUENCE_FINAL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/spend.cpp"
                  ,0x3d9,
                  "void wallet::DiscourageFeeSniping(CMutableTransaction &, FastRandomContext &, interfaces::Chain &, const uint256 &, int)"
                 );
  }
  __assert_fail("tx.nLockTime < LOCKTIME_THRESHOLD",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/spend.cpp"
                ,0x3d5,
                "void wallet::DiscourageFeeSniping(CMutableTransaction &, FastRandomContext &, interfaces::Chain &, const uint256 &, int)"
               );
}

Assistant:

static void DiscourageFeeSniping(CMutableTransaction& tx, FastRandomContext& rng_fast,
                                 interfaces::Chain& chain, const uint256& block_hash, int block_height)
{
    // All inputs must be added by now
    assert(!tx.vin.empty());
    // Discourage fee sniping.
    //
    // For a large miner the value of the transactions in the best block and
    // the mempool can exceed the cost of deliberately attempting to mine two
    // blocks to orphan the current best block. By setting nLockTime such that
    // only the next block can include the transaction, we discourage this
    // practice as the height restricted and limited blocksize gives miners
    // considering fee sniping fewer options for pulling off this attack.
    //
    // A simple way to think about this is from the wallet's point of view we
    // always want the blockchain to move forward. By setting nLockTime this
    // way we're basically making the statement that we only want this
    // transaction to appear in the next block; we don't want to potentially
    // encourage reorgs by allowing transactions to appear at lower heights
    // than the next block in forks of the best chain.
    //
    // Of course, the subsidy is high enough, and transaction volume low
    // enough, that fee sniping isn't a problem yet, but by implementing a fix
    // now we ensure code won't be written that makes assumptions about
    // nLockTime that preclude a fix later.
    if (IsCurrentForAntiFeeSniping(chain, block_hash)) {
        tx.nLockTime = block_height;

        // Secondly occasionally randomly pick a nLockTime even further back, so
        // that transactions that are delayed after signing for whatever reason,
        // e.g. high-latency mix networks and some CoinJoin implementations, have
        // better privacy.
        if (rng_fast.randrange(10) == 0) {
            tx.nLockTime = std::max(0, int(tx.nLockTime) - int(rng_fast.randrange(100)));
        }
    } else {
        // If our chain is lagging behind, we can't discourage fee sniping nor help
        // the privacy of high-latency transactions. To avoid leaking a potentially
        // unique "nLockTime fingerprint", set nLockTime to a constant.
        tx.nLockTime = 0;
    }
    // Sanity check all values
    assert(tx.nLockTime < LOCKTIME_THRESHOLD); // Type must be block height
    assert(tx.nLockTime <= uint64_t(block_height));
    for (const auto& in : tx.vin) {
        // Can not be FINAL for locktime to work
        assert(in.nSequence != CTxIn::SEQUENCE_FINAL);
        // May be MAX NONFINAL to disable both BIP68 and BIP125
        if (in.nSequence == CTxIn::MAX_SEQUENCE_NONFINAL) continue;
        // May be MAX BIP125 to disable BIP68 and enable BIP125
        if (in.nSequence == MAX_BIP125_RBF_SEQUENCE) continue;
        // The wallet does not support any other sequence-use right now.
        assert(false);
    }
}